

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O3

LY_ERR ly_getutf8(char **input,uint32_t *utf8_char,size_t *bytes_read)

{
  byte bVar1;
  byte *pbVar2;
  LY_ERR LVar3;
  uint uVar4;
  uint64_t i;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  pbVar2 = (byte *)*input;
  bVar1 = *pbVar2;
  uVar4 = (uint)(char)bVar1;
  if ((char)bVar1 < '\0') {
    if ((uVar4 & 0xe0) == 0xc0) {
      if (((pbVar2[1] & 0xffffffc0) == 0x80) && (uVar4 = (uVar4 & 0x1f) << 6, 0x7f < uVar4)) {
        uVar4 = uVar4 | pbVar2[1] & 0x3f;
        sVar5 = 2;
        goto LAB_0010eaaa;
      }
    }
    else if ((uVar4 & 0xf0) == 0xe0) {
      lVar6 = 0;
      uVar4 = uVar4 & 0xf;
      do {
        uVar7 = uVar4;
        if ((pbVar2[lVar6 + 1] & 0xffffffc0) != 0x80) goto LAB_0010eba4;
        uVar8 = uVar7 << 6;
        uVar4 = pbVar2[lVar6 + 1] & 0x3f | uVar8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
      if (((0x7ff < uVar8) && (uVar4 < 0xfffe)) && (sVar5 = 3, (uVar7 & 0x3ffffe0) != 0x360))
      goto LAB_0010eaaa;
    }
    else if ((uVar4 & 0xf8) == 0xf0) {
      uVar4 = uVar4 & 7;
      lVar6 = 1;
      do {
        if ((pbVar2[lVar6] & 0xc0) != 0x80) goto LAB_0010eba4;
        uVar7 = uVar4 * 0x40;
        uVar4 = pbVar2[lVar6] & 0x3f | uVar7;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      sVar5 = 4;
      if (0xffef0fff < uVar7 - 0x110000) goto LAB_0010eaaa;
    }
  }
  else {
    sVar5 = 1;
    if ((0x1f < bVar1) || ((bVar1 < 0xe && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)))) {
LAB_0010eaaa:
      *utf8_char = uVar4;
      *input = (char *)(pbVar2 + sVar5);
      LVar3 = LY_SUCCESS;
      if (bytes_read == (size_t *)0x0) {
        return LY_SUCCESS;
      }
      goto LAB_0010ebb5;
    }
  }
LAB_0010eba4:
  LVar3 = LY_EINVAL;
  if (bytes_read == (size_t *)0x0) {
    return LY_EINVAL;
  }
  sVar5 = 0;
LAB_0010ebb5:
  *bytes_read = sVar5;
  return LVar3;
}

Assistant:

LY_ERR
ly_getutf8(const char **input, uint32_t *utf8_char, size_t *bytes_read)
{
    uint32_t c, aux;
    size_t len;

    c = (*input)[0];

    if (!(c & 0x80)) {
        /* one byte character */
        len = 1;

        if ((c < 0x20) && (c != 0x9) && (c != 0xa) && (c != 0xd)) {
            goto error;
        }
    } else if ((c & 0xe0) == 0xc0) {
        /* two bytes character */
        len = 2;

        aux = (*input)[1];
        if ((aux & 0xc0) != 0x80) {
            goto error;
        }
        c = ((c & 0x1f) << 6) | (aux & 0x3f);

        if (c < 0x80) {
            goto error;
        }
    } else if ((c & 0xf0) == 0xe0) {
        /* three bytes character */
        len = 3;

        c &= 0x0f;
        for (uint64_t i = 1; i <= 2; i++) {
            aux = (*input)[i];
            if ((aux & 0xc0) != 0x80) {
                goto error;
            }

            c = (c << 6) | (aux & 0x3f);
        }

        if ((c < 0x800) || ((c > 0xd7ff) && (c < 0xe000)) || (c > 0xfffd)) {
            goto error;
        }
    } else if ((c & 0xf8) == 0xf0) {
        /* four bytes character */
        len = 4;

        c &= 0x07;
        for (uint64_t i = 1; i <= 3; i++) {
            aux = (*input)[i];
            if ((aux & 0xc0) != 0x80) {
                goto error;
            }

            c = (c << 6) | (aux & 0x3f);
        }

        if ((c < 0x1000) || (c > 0x10ffff)) {
            goto error;
        }
    } else {
        goto error;
    }

    (*utf8_char) = c;
    (*input) += len;
    if (bytes_read) {
        (*bytes_read) = len;
    }
    return LY_SUCCESS;

error:
    if (bytes_read) {
        (*bytes_read) = 0;
    }
    return LY_EINVAL;
}